

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_get.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownGet
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
  *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  pointer puVar3;
  int iVar4;
  FilterPushdownResult FVar5;
  pointer this_01;
  LogicalGet *get;
  pointer pFVar6;
  pointer pEVar7;
  type pEVar8;
  table_function_pushdown_complex_filter_t p_Var9;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var10;
  reference pvVar11;
  reference this_02;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var12;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
  *filter;
  pointer *__ptr;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
  *__range2;
  size_type __n;
  undefined1 auVar13 [8];
  ulong uVar14;
  vector<duckdb::FilterPushdownResult,_true> pushdown_results;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_> local_a8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  LogicalOperator *local_80;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_78;
  LogicalOperator *local_70;
  undefined1 local_68 [8];
  pointer puStack_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr p_Stack_48;
  size_t local_40;
  FilterCombiner *local_38;
  
  local_88._M_head_impl = (LogicalOperator *)this;
  local_78 = in_RDX;
  this_01 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(in_RDX);
  get = LogicalOperator::Cast<duckdb::LogicalGet>(this_01);
  p_Var9 = (get->function).pushdown_complex_filter;
  if ((p_Var9 != (table_function_pushdown_complex_filter_t)0x0) ||
     ((get->function).filter_pushdown == true)) {
    _Var10._M_head_impl =
         op[0x21].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    _Var12._M_head_impl =
         op[0x22].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (_Var10._M_head_impl != _Var12._M_head_impl) {
      do {
        pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                 ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                               *)_Var10._M_head_impl);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pFVar6->filter);
        iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[6])(pEVar7);
        if ((char)iVar4 != '\0') {
          pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                   ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                                 *)_Var10._M_head_impl);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pFVar6->filter);
          BoundParameterExpression::InvalidateRecursive(pEVar8);
        }
        _Var10._M_head_impl = (LogicalOperator *)&(_Var10._M_head_impl)->type;
      } while (_Var10._M_head_impl != _Var12._M_head_impl);
      p_Var9 = (get->function).pushdown_complex_filter;
    }
    if (p_Var9 != (table_function_pushdown_complex_filter_t)0x0) {
      local_68 = (undefined1  [8])0x0;
      puStack_60 = (pointer)0x0;
      local_58 = (_Base_ptr)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_68,
                (long)op[0x22].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                (long)op[0x21].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl >> 3);
      this_00 = (vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                 *)(op + 0x21);
      _Var10._M_head_impl =
           op[0x21].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      _Var12._M_head_impl =
           op[0x22].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      if (_Var10._M_head_impl != _Var12._M_head_impl) {
        do {
          pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                   ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                                 *)_Var10._M_head_impl);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)local_68,&pFVar6->filter);
          _Var10._M_head_impl = (LogicalOperator *)&(_Var10._M_head_impl)->type;
        } while (_Var10._M_head_impl != _Var12._M_head_impl);
        _Var10._M_head_impl = *(LogicalOperator **)this_00;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
      ::_M_erase_at_end((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                         *)this_00,(pointer)_Var10._M_head_impl);
      (*(get->function).pushdown_complex_filter)
                ((ClientContext *)
                 ((op->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                 _vptr_LogicalOperator,get,
                 (get->bind_data).
                 super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                 .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_68);
      puVar3 = puStack_60;
      auVar13 = local_68;
      if (local_68 == (undefined1  [8])puStack_60) {
        (local_88._M_head_impl)->_vptr_LogicalOperator =
             (_func_int **)
             (local_78->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_78->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_68);
        return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                )local_88._M_head_impl;
      }
      do {
        local_a8.
        super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x40);
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_buckets =
             &(((Filter *)
               local_a8.
               super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
               ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_single_bucket;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_bucket_count = 1;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)0x0;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_element_count = 0;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_rehash_policy.
        _M_max_load_factor = 1.0;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_rehash_policy._M_next_resize
             = 0;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->bindings)._M_h._M_single_bucket =
             (__node_base_ptr)0x0;
        (((Filter *)
         local_a8.
         super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
         ._M_impl.super__Vector_impl_data._M_start)->filter).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                 ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                               *)&local_a8);
        _Var1._M_head_impl =
             (((pointer)auVar13)->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (((pointer)auVar13)->
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        _Var2._M_head_impl =
             (pFVar6->filter).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pFVar6->filter).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
        if (_Var2._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        }
        pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                 ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                               *)&local_a8);
        Filter::ExtractBindings(pFVar6);
        ::std::
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                  (this_00,(unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                            *)&local_a8);
        if ((Filter *)
            local_a8.
            super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
            ._M_impl.super__Vector_impl_data._M_start != (Filter *)0x0) {
          ::std::default_delete<duckdb::FilterPushdown::Filter>::operator()
                    ((default_delete<duckdb::FilterPushdown::Filter> *)&local_a8,
                     (Filter *)
                     local_a8.
                     super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        auVar13 = (undefined1  [8])((long)auVar13 + 8);
      } while (auVar13 != (undefined1  [8])puVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_68);
    }
  }
  if (((get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     ((get->function).filter_pushdown != false)) {
    PushFilters((FilterPushdown *)op);
    local_a8.
    super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>.
    _M_impl.super__Vector_impl_data._M_finish = (FilterPushdownResult *)0x0;
    local_a8.
    super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (FilterPushdownResult *)0x0;
    local_38 = (FilterCombiner *)(op + 1);
    FilterCombiner::GenerateTableScanFilters
              ((TableFilterSet *)local_68,local_38,get,
               (vector<duckdb::FilterPushdownResult,_true> *)&local_a8);
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
    ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
             *)&get->table_filters);
    if (local_58 != (_Base_ptr)0x0) {
      (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)puStack_60;
      (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_58
      ;
      (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_50;
      (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           p_Stack_48;
      local_58->_M_parent =
           &(get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header;
      (get->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_node_count = local_40;
      local_58 = (_Base_ptr)0x0;
      local_40 = 0;
      local_50 = (_Base_ptr)&puStack_60;
      p_Stack_48 = (_Base_ptr)&puStack_60;
    }
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                 *)local_68);
    GenerateFilters((FilterPushdown *)op);
    uVar14 = (long)local_a8.
                   super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_a8.
                   super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2;
    _Var10._M_head_impl =
         op[0x21].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    _Var12._M_head_impl =
         op[0x22].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (uVar14 < (ulong)((long)_Var12._M_head_impl - (long)_Var10._M_head_impl >> 3)) {
      do {
        local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
        if (local_a8.
            super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a8.
            super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
          ::_M_realloc_insert<duckdb::FilterPushdownResult>
                    (&local_a8,
                     (iterator)
                     local_a8.
                     super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(FilterPushdownResult *)local_68);
          _Var10._M_head_impl =
               op[0x21].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          _Var12._M_head_impl =
               op[0x22].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        }
        else {
          *local_a8.
           super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
           ._M_impl.super__Vector_impl_data._M_finish = NO_PUSHDOWN;
          local_a8.
          super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_a8.
               super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)_Var12._M_head_impl - (long)_Var10._M_head_impl >> 3));
    }
    if (_Var12._M_head_impl != _Var10._M_head_impl) {
      __n = 0;
      do {
        pvVar11 = vector<duckdb::FilterPushdownResult,_true>::operator[]
                            ((vector<duckdb::FilterPushdownResult,_true> *)&local_a8,__n);
        if (*pvVar11 == NO_PUSHDOWN) {
          this_02 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                                  *)(op + 0x21),__n);
          pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                   ::operator->(this_02);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pFVar6->filter);
          iVar4 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar8);
          if ((((char)iVar4 == '\0') &&
              (iVar4 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x10])(pEVar8),
              (char)iVar4 == '\0')) &&
             (FVar5 = FilterCombiner::TryPushdownGenericExpression(local_38,get,pEVar8),
             FVar5 == PUSHED_DOWN_FULLY)) {
            vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
            ::erase_at((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                        *)(op + 0x21),__n);
            vector<duckdb::FilterPushdownResult,_true>::erase_at
                      ((vector<duckdb::FilterPushdownResult,_true> *)&local_a8,__n);
            __n = __n - 1;
          }
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)op[0x22].
                                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                   _M_head_impl -
                             (long)op[0x21].
                                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                   _M_head_impl >> 3));
    }
    local_80 = (local_78->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_78->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    FinishPushdown((FilterPushdown *)local_88._M_head_impl,op);
    if (local_80 != (LogicalOperator *)0x0) {
      (*local_80->_vptr_LogicalOperator[1])();
    }
    local_80 = (LogicalOperator *)0x0;
    if (local_a8.
        super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_70 = (local_78->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_78->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    FinishPushdown((FilterPushdown *)local_88._M_head_impl,op);
    if (local_70 != (LogicalOperator *)0x0) {
      (*local_70->_vptr_LogicalOperator[1])();
    }
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         local_88._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownGet(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_GET);
	auto &get = op->Cast<LogicalGet>();

	if (get.function.pushdown_complex_filter || get.function.filter_pushdown) {
		// this scan supports some form of filter push-down
		// check if there are any parameters
		// if there are, invalidate them to force a re-bind on execution
		for (auto &filter : filters) {
			if (filter->filter->HasParameter()) {
				// there is a parameter in the filters! invalidate it
				BoundParameterExpression::InvalidateRecursive(*filter->filter);
			}
		}
	}
	if (get.function.pushdown_complex_filter) {
		// for the remaining filters, check if we can push any of them into the scan as well
		vector<unique_ptr<Expression>> expressions;
		expressions.reserve(filters.size());
		for (auto &filter : filters) {
			expressions.push_back(std::move(filter->filter));
		}
		filters.clear();

		get.function.pushdown_complex_filter(optimizer.context, get, get.bind_data.get(), expressions);

		if (expressions.empty()) {
			return op;
		}
		// re-generate the filters
		for (auto &expr : expressions) {
			auto f = make_uniq<Filter>();
			f->filter = std::move(expr);
			f->ExtractBindings();
			filters.push_back(std::move(f));
		}
	}

	if (!get.table_filters.filters.empty() || !get.function.filter_pushdown) {
		// the table function does not support filter pushdown: push a LogicalFilter on top
		return FinishPushdown(std::move(op));
	}
	PushFilters();

	//! We generate the table filters that will be executed during the table scan
	vector<FilterPushdownResult> pushdown_results;
	get.table_filters = combiner.GenerateTableScanFilters(get, pushdown_results);

	GenerateFilters();

	for (idx_t i = pushdown_results.size(); i < filters.size(); ++i) {
		// any generated filters have not been pushed down yet
		pushdown_results.push_back(FilterPushdownResult::NO_PUSHDOWN);
	}
	// for any filters we did not manage to push into specialized table filters - try to push them as a generic
	// expression
	for (idx_t i = 0; i < filters.size(); ++i) {
		// get the previous pushdown result
		auto pushdown_result = pushdown_results[i];
		if (pushdown_result != FilterPushdownResult::NO_PUSHDOWN) {
			// this has already been (partially) pushed down - skip
			continue;
		}
		auto &expr = *filters[i]->filter;
		if (expr.IsVolatile() || expr.CanThrow()) {
			// we cannot push down volatile or throwing expressions
			continue;
		}
		pushdown_result = combiner.TryPushdownGenericExpression(get, expr);
		if (pushdown_result == FilterPushdownResult::PUSHED_DOWN_FULLY) {
			filters.erase_at(i);
			pushdown_results.erase_at(i);
			i--;
		}
	}

	//! Now we try to pushdown the remaining filters to perform zonemap checking
	return FinishPushdown(std::move(op));
}